

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
adios2::query::QueryVar::LoadSelection(QueryVar *this,string *startStr,string *countStr)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  QueryVar *in_RDI;
  Dims shape;
  char in_stack_00000177;
  string *in_stack_00000178;
  Dims count;
  Dims start;
  Dims *in_stack_fffffffffffffe00;
  allocator *paVar3;
  Dims *in_stack_fffffffffffffe08;
  QueryVar *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 uVar4;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator<char> local_131;
  Dims *in_stack_fffffffffffffed0;
  QueryVar *in_stack_fffffffffffffed8;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [48];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30 [2];
  
  uVar4 = 0x2c;
  split(in_stack_00000178,in_stack_00000177);
  split(in_stack_00000178,in_stack_00000177);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_30);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_48);
  if (__rhs != pbVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Toolkit",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"query::QueryVar",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"LoadSelection",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,"dim of startcount does match in the bounding box definition",&local_f1);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (string *)CONCAT44(uVar4,in_stack_fffffffffffffe50),(string *)in_RDI,
               (int)((ulong)__rhs >> 0x20));
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(uVar4,in_stack_fffffffffffffe50),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  SetSelection(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  bVar1 = IsSelectionValid(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  if (!bVar1) {
    in_stack_fffffffffffffe10 = (QueryVar *)&local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffed0,"Toolkit",(allocator *)in_stack_fffffffffffffe10);
    paVar3 = &local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"query::QueryVar",paVar3);
    paVar3 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"LoadSelection",paVar3);
    GetVarName_abi_cxx11_(in_RDI);
    std::operator+((char *)in_RDI,__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (string *)CONCAT44(uVar4,in_stack_fffffffffffffe50),(string *)in_RDI,
               (int)((ulong)__rhs >> 0x20));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    std::allocator<char>::~allocator(&local_131);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

void QueryVar::LoadSelection(const std::string &startStr, const std::string &countStr)
{
    adios2::Dims start = split(startStr, ',');
    adios2::Dims count = split(countStr, ',');

    if (start.size() != count.size())
    {
        helper::Throw<std::ios_base::failure>(
            "Toolkit", "query::QueryVar", "LoadSelection",
            "dim of startcount does match in the bounding box definition");
    }

    // simpleQ.setSelection(box.first, box.second);
    adios2::Dims shape = this->m_Selection.second; // set at the creation for default
    this->SetSelection(start, count);
    if (!this->IsSelectionValid(shape))
        helper::Throw<std::ios_base::failure>("Toolkit", "query::QueryVar", "LoadSelection",
                                              "invalid selections for selection of var: " +
                                                  this->GetVarName());
}